

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O3

void write_value_table(double *values,double *space_coordinates,uint space_nodes,char *filename)

{
  size_t sVar1;
  ulong uVar2;
  char iteration_buffer [32];
  char values_to_string [131072];
  char acStack_20058 [32];
  char acStack_20038 [131080];
  
  memset(acStack_20058 + 0x20,0,0x20000);
  if (space_nodes != 0) {
    uVar2 = 0;
    do {
      snprintf(acStack_20058,0x20,"%.6lf %.6lf\n",SUB84(space_coordinates[uVar2],0),values[uVar2]);
      sVar1 = strlen(acStack_20058 + 0x20);
      strncat(acStack_20058 + 0x20,acStack_20058,0x1ffff - sVar1);
      uVar2 = uVar2 + 1;
    } while (space_nodes != uVar2);
  }
  rewrite_file(filename,acStack_20058 + 0x20);
  return;
}

Assistant:

void write_value_table (double const * values,
                        double const * space_coordinates,
                        unsigned space_nodes,
                        char * filename) {

  char values_to_string[MAX_BUFFER_SIZE] = "";

  char iteration_buffer[SMALL_BUFFER_SIZE] = "";

  unsigned space_step = 0;

  for (space_step = 0; space_step < space_nodes; ++space_step) {
    snprintf (iteration_buffer, 
              SMALL_BUFFER_SIZE, 
              "%.6lf %.6lf\n", 
              space_coordinates[space_step], 
              values[space_step]);
    strncat (values_to_string, iteration_buffer, MAX_BUFFER_SIZE - strlen(values_to_string) - 1);
  }

  rewrite_file (filename, values_to_string);
  return;
}